

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Finger.cpp
# Opt level: O1

bool __thiscall Finger::checkDists(Finger *this)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Point local_48;
  Point local_40;
  Point local_38;
  Point local_30;
  Point local_28;
  Point local_20;
  
  bVar2 = true;
  if (this->shouldCheckDist == true) {
    iVar1 = (this->boundingBox).height / 5;
    local_20.x = (this->ptStart).x;
    local_20.y = (this->ptStart).y;
    local_28.x = (this->ptFar).x;
    local_28.y = (this->ptFar).y;
    dVar3 = getDist(&local_20,&local_28);
    local_30.x = (this->ptEnd).x;
    local_30.y = (this->ptEnd).y;
    local_38.x = (this->ptFar).x;
    local_38.y = (this->ptFar).y;
    dVar4 = getDist(&local_30,&local_38);
    local_40.x = (this->ptStart).x;
    local_40.y = (this->ptStart).y;
    local_48.x = (this->ptEnd).x;
    local_48.y = (this->ptEnd).y;
    dVar5 = getDist(&local_40,&local_48);
    bVar2 = false;
    if ((iVar1 < (int)dVar3) && (bVar2 = false, iVar1 < (int)dVar4)) {
      bVar2 = (int)dVar5 < (int)((double)iVar1 * 3.5);
    }
    this->ok = bVar2;
  }
  return bVar2;
}

Assistant:

bool Finger::checkDists() {
    if (!shouldCheckDist)
        return true;

    int minDist = boundingBox.height / 5;
    int maxDist = minDist * 3.5;

    int d1 = getDist(ptStart, ptFar);
    int d2 = getDist(ptEnd, ptFar);
    int d3 = getDist(ptStart, ptEnd);

    ok = (d1 > minDist && d2 > minDist)
         && (d3 < maxDist);
    return ok;
}